

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_pdf(REF_GRID ref_grid,char *pdf_filename)

{
  int iVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char local_448 [4];
  REF_STATUS ref_private_macro_code_rss;
  char command [1024];
  char temp_filename [28];
  char *pdf_filename_local;
  REF_GRID ref_grid_local;
  
  builtin_strncpy(command + 0x3f8,"ref_expo",8);
  ref_grid_local._4_4_ = ref_export_eps(ref_grid,command + 0x3f8);
  if (ref_grid_local._4_4_ == 0) {
    snprintf(local_448,0x400,"epstopdf %s -o=%s",command + 0x3f8,pdf_filename);
    iVar1 = system(local_448);
    if ((long)iVar1 == 0) {
      iVar1 = remove(command + 0x3f8);
      if ((long)iVar1 == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6f9,"ref_export_pdf","temp clean up",0,(long)iVar1);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6f8,"ref_export_pdf","epstopdf failed",0,(long)iVar1);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x6f6,
           "ref_export_pdf",(ulong)ref_grid_local._4_4_,"temp eps");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_pdf(REF_GRID ref_grid,
                                         const char *pdf_filename) {
  char temp_filename[] = "ref_export_temp_for_pdf.eps";
  char command[1024];
  RSS(ref_export_eps(ref_grid, temp_filename), "temp eps");
  snprintf(command, 1024, "epstopdf %s -o=%s", temp_filename, pdf_filename);
  REIS(0, system(command), "epstopdf failed");
  REIS(0, remove(temp_filename), "temp clean up");

  return REF_SUCCESS;
}